

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poly.cpp
# Opt level: O0

string * __thiscall poly::pretty_abi_cxx11_(string *__return_storage_ptr__,poly *this)

{
  int iVar1;
  ostream *poVar2;
  size_type sVar3;
  undefined1 local_1e0 [8];
  __string_type s;
  int local_1ac;
  stringstream local_1a8 [4];
  int i;
  stringstream ss;
  ostream local_198 [376];
  poly *local_20;
  poly *rthis;
  poly *this_local;
  
  local_20 = this;
  rthis = this;
  this_local = (poly *)__return_storage_ptr__;
  iVar1 = degree(this);
  if (iVar1 == 0) {
    iVar1 = operator[](local_20,0);
    std::__cxx11::to_string(__return_storage_ptr__,iVar1);
  }
  else {
    std::__cxx11::stringstream::stringstream(local_1a8);
    for (local_1ac = degree(this); 1 < local_1ac; local_1ac = local_1ac + -1) {
      iVar1 = operator[](local_20,local_1ac);
      if (iVar1 != 0) {
        poVar2 = std::operator<<(local_198,"x^");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1ac);
        std::operator<<(poVar2," + ");
      }
    }
    iVar1 = operator[](local_20,1);
    if (iVar1 != 0) {
      std::operator<<(local_198,"x + ");
    }
    iVar1 = operator[](local_20,0);
    if (iVar1 != 0) {
      std::operator<<(local_198,"1 + ");
    }
    std::__cxx11::stringstream::str();
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1e0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0,0,
               sVar3 - 3);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::stringstream::~stringstream(local_1a8);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string poly::pretty() const {
    const auto &rthis = *this;
    if (degree() == 0)
        return std::to_string(rthis[0]);

    std::stringstream ss;
    for (int i = degree(); i >= 2; i--)
        if (rthis[i])
            ss << "x^" << i << " + ";
    if (rthis[1])
        ss << "x + ";
    if (rthis[0])
        ss << "1 + ";

    auto s = ss.str();
    return s.substr(0, s.size() - 3);
}